

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_ori_16_toc(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar1 = m68ki_cpu.x_flag & 0x100;
  uVar3 = m68ki_cpu.n_flag & 0x80;
  bVar6 = m68ki_cpu.not_z_flag != 0;
  uVar4 = m68ki_cpu.v_flag & 0x80;
  uVar5 = m68ki_cpu.c_flag & 0x100;
  uVar2 = m68ki_read_imm_8();
  m68ki_set_ccr((uVar1 | uVar3) >> 4 | (uint)((bVar6 ^ 0xffU) & 1) << 2 | uVar4 >> 6 | uVar5 >> 8 |
                uVar2);
  return;
}

Assistant:

static void m68k_op_ori_16_toc(void)
{
	m68ki_set_ccr(m68ki_get_ccr() | OPER_I_8());
}